

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O0

int32 __thiscall mkvmuxer::MkvWriter::Position(MkvWriter *this,int64 position)

{
  int64 position_local;
  MkvWriter *this_local;
  
  if (this->file_ == (FILE *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = fseeko((FILE *)this->file_,position,0);
  }
  return this_local._4_4_;
}

Assistant:

int32 MkvWriter::Position(int64 position) {
  if (!file_)
    return -1;

#ifdef _MSC_VER
  return _fseeki64(file_, position, SEEK_SET);
#elif defined(_WIN32)
  return fseeko64(file_, static_cast<off_t>(position), SEEK_SET);
#elif !(defined(__ANDROID__) && __ANDROID_API__ < 24 && !defined(__LP64__) && \
        defined(_FILE_OFFSET_BITS) && _FILE_OFFSET_BITS == 64)
  // POSIX.1 has fseeko and ftello. fseeko and ftello are not available before
  // Android API level 24. See
  // https://android.googlesource.com/platform/bionic/+/main/docs/32-bit-abi.md
  return fseeko(file_, static_cast<off_t>(position), SEEK_SET);
#else
  return fseek(file_, static_cast<long>(position), SEEK_SET);
#endif
}